

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall CaDiCaL::LratChecker::report_status(LratChecker *this,int param_2,uint64_t param_3)

{
  Internal *pIVar1;
  long lVar2;
  FILE *profile;
  FILE *in_RSI;
  long in_RDI;
  double s;
  double s_00;
  
  profile = in_RSI;
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1680) <= *(int *)(*(long *)(in_RDI + 8) + 0xe18)) {
    pIVar1 = *(Internal **)(in_RDI + 8);
    profile = (FILE *)(*(long *)(in_RDI + 8) + 0x1660);
    Internal::time(*(Internal **)(in_RDI + 8),(time_t *)in_RSI);
    Internal::start_profiling(pIVar1,(Profile *)profile,s);
  }
  if (*(long *)(in_RDI + 200) == *(long *)(in_RDI + 0xc0)) {
    *(undefined8 *)(in_RDI + 200) = 0;
  }
  else {
    fatal_message_start();
    fputs("finalize check failed ",_stderr);
    fprintf(_stderr,"%lu",*(undefined8 *)(in_RDI + 0xc0));
    profile = _stderr;
    fputs(" are not finalized",_stderr);
    fatal_message_end();
  }
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1680) <= *(int *)(*(long *)(in_RDI + 8) + 0xe18)) {
    pIVar1 = *(Internal **)(in_RDI + 8);
    lVar2 = *(long *)(in_RDI + 8);
    Internal::time(*(Internal **)(in_RDI + 8),(time_t *)profile);
    Internal::stop_profiling(pIVar1,(Profile *)(lVar2 + 0x1660),s_00);
  }
  return;
}

Assistant:

void LratChecker::report_status (int, uint64_t) {
  START (checking);
  if (num_finalized == num_clauses) {
    num_finalized = 0;
    LOG ("LRAT CHECKER successful finalize check, all clauses have been "
         "deleted");
  } else {
    fatal_message_start ();
    fputs ("finalize check failed ", stderr);
    fprintf (stderr, "%" PRIu64, num_clauses);
    fputs (" are not finalized", stderr);
    fatal_message_end ();
  }
  STOP (checking);
}